

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O0

void gen_ss_advance(DisasContext_conflict1 *s)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGContext_conflict1 *tcg_ctx;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((s->ss_active & 1U) != 0) {
    s->pstate_ss = false;
    clear_pstate_bits(tcg_ctx_00,0x200000);
  }
  return;
}

Assistant:

static inline void gen_ss_advance(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->ss_active) {
        s->pstate_ss = 0;
        clear_pstate_bits(tcg_ctx, PSTATE_SS);
    }
}